

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool gen_arith(TCGContext_conflict11 *tcg_ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 source2;
  TCGv_i64 source1;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func_local;
  arg_r_conflict *a_local;
  TCGContext_conflict11 *tcg_ctx_local;
  
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_get_gpr(tcg_ctx,t,a->rs1);
  gen_get_gpr(tcg_ctx,t_00,a->rs2);
  (*func)(tcg_ctx,t,t,t_00);
  gen_set_gpr(tcg_ctx,a->rd,t);
  tcg_temp_free_i64(tcg_ctx,t);
  tcg_temp_free_i64(tcg_ctx,t_00);
  return true;
}

Assistant:

static void gen_arith(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0 && opc != OPC_ADD && opc != OPC_SUB
       && opc != OPC_DADD && opc != OPC_DSUB) {
        /*
         * If no destination, treat it as a NOP.
         * For add & sub, we must generate the overflow exception when needed.
         */
        return;
    }

    switch (opc) {
    case OPC_ADD:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_ADDU:
        if (rs != 0 && rt != 0) {
            tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_SUB:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_sub_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_xor_tl(tcg_ctx, t2, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t0, t1);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /*
             * operands of different sign, first operand and the result
             * of different sign
             */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_SUBU:
        if (rs != 0 && rt != 0) {
            tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_neg_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DADD:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_add_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t0, t2);
            tcg_gen_andc_tl(tcg_ctx, t1, t2, t1);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DADDU:
        if (rs != 0 && rt != 0) {
            tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_DSUB:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            gen_load_gpr(tcg_ctx, t2, rt);
            tcg_gen_sub_tl(tcg_ctx, t0, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t2, t1, t2);
            tcg_gen_xor_tl(tcg_ctx, t1, t0, t1);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /*
             * Operands of different sign, first operand and result different
             * sign.
             */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rd);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DSUBU:
        if (rs != 0 && rt != 0) {
            tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_neg_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
#endif
    case OPC_MUL:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_mul_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}